

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O3

bool __thiscall t_st_generator::is_vowel(t_st_generator *this,char c)

{
  uint uVar1;
  int iVar2;
  undefined3 in_register_00000031;
  
  iVar2 = tolower(CONCAT31(in_register_00000031,c));
  uVar1 = iVar2 - 0x61U >> 1;
  return (bool)((byte)(0x495 >> ((byte)uVar1 & 0x1f)) &
               (uVar1 | (uint)((iVar2 - 0x61U & 1) != 0) << 0x1f) < 0xb);
}

Assistant:

bool t_st_generator::is_vowel(char c) {
  switch (tolower(c)) {
  case 'a':
  case 'e':
  case 'i':
  case 'o':
  case 'u':
    return true;
  }
  return false;
}